

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O0

void __thiscall
agge::tests::LayoutTests::MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow
          (LayoutTests *this)

{
  element_type *peVar1;
  glyph *local_508;
  allocator local_499;
  string local_498;
  LocationInfo local_478;
  float local_450;
  allocator local_449;
  string local_448;
  LocationInfo local_428;
  float local_400;
  allocator local_3f9;
  string local_3f8;
  LocationInfo local_3d8;
  float local_3b0;
  box_r local_3ac;
  box_r box3;
  box_r box2;
  box_r box1;
  richtext_t local_370;
  allocator local_301;
  string local_300;
  richtext_t local_2e0;
  allocator local_271;
  string local_270;
  richtext_t local_250;
  undefined1 local_1e8 [8];
  layout l3;
  layout l2;
  layout l1;
  undefined1 local_e8 [8];
  factory_ptr f;
  glyph glyphs [4];
  char_to_index indices [4];
  LayoutTests *this_local;
  
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x20;
  f.super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x401c666666666666;
  glyphs[0].metrics.dx = 0.0;
  glyphs[0].metrics.dy = 0.0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[0].metrics.dy);
  glyphs[0].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4026000000000000;
  glyphs[1].metrics.dx = 0.0;
  glyphs[1].metrics.dy = 0.0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[1].metrics.dy);
  glyphs[1].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x402a000000000000;
  glyphs[2].metrics.dx = 0.0;
  glyphs[2].metrics.dy = 0.0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[2].metrics.dy);
  glyphs[2].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x4031000000000000;
  glyphs[3].metrics.dx = 0.0;
  glyphs[3].metrics.dy = 0.0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  glyphs[3].outline.
  super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>::vector
            ((vector<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_> *)
             &glyphs[3].metrics.dy);
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_e8,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm1,
             (glyph (*) [4])
             &glyphs[3].outline.
              super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  layout::layout((layout *)&l2._box);
  layout::layout((layout *)&l3._box);
  layout::layout((layout *)local_1e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_270,"ABC CBA AB\nABB BBC\n",&local_271);
  R(&local_250,&local_270);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_e8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l2._box,&local_250,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator((allocator<char> *)&local_271);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_300,"AC CB\nA AB\nABB BBC\n",&local_301);
  R(&local_2e0,&local_300);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_e8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)&l3._box,&local_2e0,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_2e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator((allocator<char> *)&local_301);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&box1.h,"AC CB\nA AB\nABB BBC",(allocator *)((long)&box1.w + 3));
  R(&local_370,(string *)&box1.h);
  peVar1 = std::
           __shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_e8);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            ((layout *)local_1e8,&local_370,peVar1);
  annotated_string<char,_agge::font_style_annotation>::~annotated_string(&local_370);
  std::__cxx11::string::~string((string *)&box1.h);
  std::allocator<char>::~allocator((allocator<char> *)((long)&box1.w + 3));
  box2 = layout::get_box((layout *)&l2._box);
  box3 = layout::get_box((layout *)&l3._box);
  local_3ac = layout::get_box((layout *)local_1e8);
  local_3b0 = 120.2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3f8,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_3f9);
  ut::LocationInfo::LocationInfo(&local_3d8,&local_3f8,0xcf);
  ut::are_equal<float,float>(&local_3b0,&box2.w,&local_3d8);
  ut::LocationInfo::~LocationInfo(&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
  local_400 = 87.1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_448,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_449);
  ut::LocationInfo::LocationInfo(&local_428,&local_448,0xd0);
  ut::are_equal<float,float>(&local_400,&box3.w,&local_428);
  ut::LocationInfo::~LocationInfo(&local_428);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  local_450 = 87.1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_498,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,&local_499);
  ut::LocationInfo::LocationInfo(&local_478,&local_498,0xd1);
  ut::are_equal<float,float>(&local_450,&local_3ac.w,&local_478);
  ut::LocationInfo::~LocationInfo(&local_478);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator((allocator<char> *)&local_499);
  layout::~layout((layout *)local_1e8);
  layout::~layout((layout *)&l3._box);
  layout::~layout((layout *)&l2._box);
  std::shared_ptr<agge::tests::LayoutTests::font_factory>::~shared_ptr
            ((shared_ptr<agge::tests::LayoutTests::font_factory> *)local_e8);
  local_508 = (glyph *)&glyphs[3].outline.
                        super__Vector_base<agge::glyph::path_point,_std::allocator<agge::glyph::path_point>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage;
  do {
    local_508 = local_508 + -1;
    mocks::font_accessor::glyph::~glyph(local_508);
  } while (local_508 !=
           (glyph *)&f.
                     super___shared_ptr<agge::tests::LayoutTests::font_factory,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount);
  return;
}

Assistant:

test( MultiLineUnboundLayoutBoxEqualsMaxOfSumOfAdvancesInEachRow )
			{
				// INIT
				mocks::font_accessor::char_to_index indices[] = { { L' ', 0 }, { L'A', 1 }, { L'B', 2 }, { L'C', 3 }, };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 7.1, 0 } },
					{ { 11, 0 } },
					{ { 13, 0 } },
					{ { 17, 0 } },
				};
				factory_ptr f = create_single_font_factory(c_fm1, indices, glyphs);

				// ACT
				layout l1;
				layout l2;
				layout l3;

				l1.process(R("ABC CBA AB\nABB BBC\n"), limit::none(), *f);
				l2.process(R("AC CB\nA AB\nABB BBC\n"), limit::none(), *f);
				l3.process(R("AC CB\nA AB\nABB BBC"), limit::none(), *f); // Last row will be checked even if no newline is encountered.

				box_r box1 = l1.get_box();
				box_r box2 = l2.get_box();
				box_r box3 = l3.get_box();

				// ASSERT
				assert_equal(120.2f, box1.w);
				assert_equal(87.1f, box2.w);
				assert_equal(87.1f, box3.w);
			}